

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O0

Float __thiscall
pbrt::LayeredBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF,_true>::PDF
          (LayeredBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF,_true> *this,Vector3f wo,Vector3f wi,
          TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  float fVar1;
  undefined1 auVar2 [16];
  Vector3<float> args;
  undefined1 auVar3 [16];
  Point2f u_00;
  Point2f u_01;
  Point2f u_02;
  Point2f u_03;
  Point2f u_04;
  undefined1 auVar4 [16];
  Vector3f wi_00;
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3f wo_02;
  Vector3f wo_03;
  Vector3f wo_04;
  Vector3f wo_05;
  Vector3f wi_01;
  Vector3f wi_02;
  Vector3f wi_03;
  Vector3f wi_04;
  Vector3f wi_05;
  Vector3f wi_06;
  Vector3f wi_07;
  Vector3f wi_08;
  Vector3f wo_06;
  Vector3f wo_07;
  Vector3f wo_08;
  Vector3f wo_09;
  Vector3f wo_10;
  Vector3f wo_11;
  Vector3f wo_12;
  Vector3f wo_13;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vector3f wi_09;
  Vector3f wo_14;
  Vector3f wp;
  Vector3f w;
  Vector3f wp_00;
  Vector3f w_00;
  bool bVar12;
  BSDFSample *pBVar13;
  int in_EDX;
  TransportMode in_ESI;
  DielectricBxDF *in_RDI;
  Float FVar14;
  Float FVar15;
  undefined8 uVar19;
  undefined1 in_ZMM0 [64];
  undefined1 auVar21 [56];
  undefined1 auVar17 [64];
  undefined8 uVar20;
  undefined1 extraout_var [56];
  undefined1 auVar18 [64];
  float in_XMM1_Da;
  undefined1 in_ZMM2 [64];
  float in_XMM3_Da;
  Vector3<float> VVar22;
  optional<pbrt::BSDFSample> wis_1;
  optional<pbrt::BSDFSample> wos_1;
  Point2f u;
  Float uc;
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> tiInterface;
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> toInterface;
  Float tPDF;
  Float wt;
  Float rPDF;
  optional<pbrt::BSDFSample> rs;
  optional<pbrt::BSDFSample> wis;
  optional<pbrt::BSDFSample> wos;
  BxDFReflTransFlags trans;
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> tInterface;
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> rInterface;
  int s;
  BxDFReflTransFlags reflFlag;
  Float pdfSum;
  bool enteredTop;
  anon_class_8_1_ba1d750b r;
  RNG rng;
  float in_stack_fffffffffffff5e8;
  float in_stack_fffffffffffff5ec;
  Float in_stack_fffffffffffff5f0;
  float in_stack_fffffffffffff5f4;
  undefined1 in_stack_fffffffffffff5f8 [16];
  undefined4 uStack_9e0;
  int in_stack_fffffffffffff624;
  undefined4 in_stack_fffffffffffff630;
  undefined4 in_stack_fffffffffffff634;
  char *in_stack_fffffffffffff638;
  float in_stack_fffffffffffff640;
  BxDFReflTransFlags in_stack_fffffffffffff644;
  TransportMode in_stack_fffffffffffff648;
  Float in_stack_fffffffffffff64c;
  BSDFSample *in_stack_fffffffffffff650;
  float in_stack_fffffffffffff658;
  float in_stack_fffffffffffff65c;
  float in_stack_fffffffffffff66c;
  undefined8 in_stack_fffffffffffff670;
  float in_stack_fffffffffffff678;
  TransportMode in_stack_fffffffffffff67c;
  BSDFSample *in_stack_fffffffffffff680;
  undefined7 in_stack_fffffffffffff688;
  undefined1 in_stack_fffffffffffff68f;
  float in_stack_fffffffffffff690;
  float in_stack_fffffffffffff69c;
  BSDFSample *in_stack_fffffffffffff6a0;
  BSDFSample *in_stack_fffffffffffff6b8;
  float in_stack_fffffffffffff6c0;
  float local_744;
  undefined8 in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e4;
  undefined4 in_stack_fffffffffffff9fc;
  undefined4 in_stack_fffffffffffffa00;
  float in_stack_fffffffffffffa04;
  undefined8 in_stack_fffffffffffffa18;
  float in_stack_fffffffffffffa20;
  optional local_5c4 [48];
  undefined8 local_594;
  undefined4 local_58c;
  undefined8 local_588;
  float local_580;
  undefined8 local_578;
  undefined8 local_570;
  float local_568;
  optional local_560 [48];
  undefined8 local_530;
  float local_524;
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> local_520;
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> local_510;
  undefined8 local_500;
  float local_4f8;
  undefined8 local_4f0;
  float local_4e8;
  undefined8 local_4e0;
  float local_4d8;
  undefined8 local_4d0;
  float local_4c8;
  undefined8 local_4c0;
  float local_4b8;
  Float local_4b0;
  Float local_4ac;
  undefined8 local_4a8;
  float local_4a0;
  undefined8 local_498;
  float local_490;
  undefined8 local_488;
  float local_480;
  undefined8 local_478;
  float local_470;
  undefined8 local_468;
  float local_460;
  undefined8 local_458;
  float local_450;
  Float local_44c;
  undefined8 local_448;
  float local_440;
  undefined8 local_438;
  float local_430;
  undefined8 local_428;
  float local_420;
  undefined8 local_418;
  float local_410;
  undefined8 local_408;
  float local_400;
  undefined8 local_3f8;
  float local_3f0;
  undefined8 local_3e0;
  float local_3d8;
  undefined8 local_3d0;
  float local_3c8;
  optional local_3c0 [48];
  undefined8 local_390;
  float local_388;
  undefined8 local_380;
  float local_378;
  undefined8 local_370;
  float local_368;
  undefined8 local_360;
  float local_358;
  undefined8 local_350;
  float local_348;
  undefined8 local_340;
  float local_338;
  undefined8 local_330;
  float local_328;
  undefined8 local_318;
  float local_310;
  undefined8 local_2d8;
  float local_2d0;
  undefined8 local_2b0;
  float local_2a8;
  optional<pbrt::BSDFSample> local_274;
  optional<pbrt::BSDFSample> local_244;
  undefined4 local_214;
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> local_210;
  TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> local_200;
  undefined8 local_1f0;
  float local_1e8;
  undefined8 local_1e0;
  float local_1d8;
  undefined8 local_1d0;
  float local_1c8;
  undefined8 local_1c0;
  float local_1b8;
  int local_1b4;
  undefined8 local_1b0;
  float local_1a8;
  undefined8 local_1a0;
  float local_198;
  undefined8 local_190;
  float local_188;
  undefined8 local_180;
  float local_178;
  undefined8 local_170;
  float local_168;
  undefined8 local_160;
  float local_158;
  undefined8 local_150;
  float local_148;
  undefined8 local_140;
  float local_138;
  undefined4 local_134;
  undefined8 local_130;
  float local_128;
  undefined8 local_120;
  float local_118;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  float local_f8;
  float local_f0;
  byte local_e9;
  undefined1 *local_e8;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  undefined1 local_a0 [16];
  undefined8 local_90;
  float local_88;
  undefined8 local_7c;
  float local_74;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  float local_58;
  TransportMode local_4c;
  undefined8 local_3c;
  undefined8 local_2c;
  float local_24;
  undefined8 local_20;
  undefined8 local_10;
  float local_8;
  undefined1 auVar16 [64];
  
  local_20 = vmovlpd_avx(in_ZMM0._0_16_);
  local_3c = vmovlpd_avx(in_ZMM2._0_16_);
  local_2c = local_3c;
  local_10 = local_20;
  if (in_EDX != 3) {
    LogFatal<char_const(&)[39]>
              ((LogLevel)((ulong)in_stack_fffffffffffff650 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
               in_stack_fffffffffffff644,in_stack_fffffffffffff638,
               (char (*) [39])CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
  }
  auVar21 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  local_4c = in_ESI;
  local_24 = in_XMM3_Da;
  local_8 = in_XMM1_Da;
  if (in_XMM1_Da < 0.0) {
    VVar22 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
    local_68 = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar16._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar16._8_56_ = auVar21;
    local_70 = vmovlpd_avx(auVar16._0_16_);
    local_60 = local_70;
    local_58 = local_68;
    local_10 = local_70;
    local_8 = local_68;
    VVar22 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
    local_88 = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar17._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar17._8_56_ = auVar21;
    local_90 = vmovlpd_avx(auVar17._0_16_);
    local_7c = local_90;
    local_74 = local_88;
    local_2c = local_90;
    local_24 = local_88;
  }
  GetOptions();
  local_a8 = local_24;
  local_b0 = local_2c;
  local_b8 = local_24;
  local_c0 = local_2c;
  VVar22.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff640;
  VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff638;
  Hash<int,pbrt::Vector3<float>>(in_stack_fffffffffffff624,VVar22);
  local_c8 = local_8;
  local_d0 = local_10;
  local_d8 = local_8;
  local_e0 = local_10;
  args.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff640;
  args.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff638;
  Hash<pbrt::Vector3<float>>(args);
  RNG::RNG((RNG *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
           CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8),0x845be9);
  local_e9 = 1;
  local_f0 = 0.0;
  local_f8 = local_8;
  local_100 = local_10;
  local_108 = local_24;
  local_110 = local_2c;
  local_118 = local_8;
  local_120 = local_10;
  w_00.super_Tuple3<pbrt::Vector3,_float>.z = local_8;
  w_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_10;
  w_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_10._4_4_;
  local_128 = local_24;
  local_130 = local_2c;
  wp_00.super_Tuple3<pbrt::Vector3,_float>.z = local_24;
  wp_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_2c;
  wp_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2c._4_4_;
  local_e8 = local_a0;
  bVar12 = SameHemisphere(w_00,wp_00);
  if (bVar12) {
    local_134 = 1;
    if ((local_e9 & 1) == 0) {
      FVar15 = in_RDI[4].mfDistrib.alpha_y;
      local_178 = local_8;
      local_180 = local_10;
      local_188 = local_24;
      local_190 = local_2c;
      local_198 = local_8;
      local_1a0 = local_10;
      local_1a8 = local_24;
      local_1b0 = local_2c;
      wo_05.super_Tuple3<pbrt::Vector3,_float>.y._3_1_ = in_stack_fffffffffffff68f;
      wo_05.super_Tuple3<pbrt::Vector3,_float>._0_7_ = in_stack_fffffffffffff688;
      wo_05.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff690;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffff670;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.z =
           (float)(int)((ulong)in_stack_fffffffffffff670 >> 0x20);
      wi_00.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff66c;
      FVar14 = DiffuseBxDF::PDF((DiffuseBxDF *)in_stack_fffffffffffff650,wo_05,wi_00,
                                (TransportMode)in_stack_fffffffffffff64c,in_stack_fffffffffffff648);
      local_744 = (float)(int)FVar15 * FVar14;
    }
    else {
      FVar15 = in_RDI[4].mfDistrib.alpha_y;
      local_138 = local_8;
      local_140 = local_10;
      local_148 = local_24;
      local_150 = local_2c;
      local_158 = local_8;
      local_160 = local_10;
      local_168 = local_24;
      local_170 = local_2c;
      wo_14.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffa20;
      wo_14.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffa18;
      wo_14.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffffa18 >> 0x20);
      wi_09.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffa00;
      wi_09.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff9fc;
      wi_09.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffa04;
      FVar14 = DielectricBxDF::PDF((DielectricBxDF *)
                                   CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                                   wo_14,wi_09,
                                   (TransportMode)((ulong)in_stack_fffffffffffff9d8 >> 0x20),
                                   (BxDFReflTransFlags)in_stack_fffffffffffff9d8);
      local_744 = (float)(int)FVar15 * FVar14;
    }
    local_f0 = local_744 + local_f0;
  }
  local_1b4 = 0;
  do {
    if ((int)in_RDI[4].mfDistrib.alpha_y <= local_1b4) {
      FVar15 = Lerp(0.9,0.07957747,local_f0 / (float)(int)in_RDI[4].mfDistrib.alpha_y);
      return FVar15;
    }
    local_1b8 = local_8;
    local_1c0 = local_10;
    local_1c8 = local_24;
    local_1d0 = local_2c;
    local_1d8 = local_8;
    local_1e0 = local_10;
    w.super_Tuple3<pbrt::Vector3,_float>.z = local_8;
    w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_10;
    w.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_10._4_4_;
    local_1e8 = local_24;
    local_1f0 = local_2c;
    wp.super_Tuple3<pbrt::Vector3,_float>.z = local_24;
    wp.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_2c;
    wp.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2c._4_4_;
    bVar12 = SameHemisphere(w,wp);
    if (bVar12) {
      TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::TopOrBottomBxDF(&local_200);
      TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::TopOrBottomBxDF(&local_210);
      if ((local_e9 & 1) == 0) {
        TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::operator=(&local_200,in_RDI);
        TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::operator=
                  (&local_210,(DiffuseBxDF *)(in_RDI + 1));
      }
      else {
        TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::operator=
                  (&local_200,(DiffuseBxDF *)(in_RDI + 1));
        TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::operator=(&local_210,in_RDI);
      }
      local_214 = 2;
      pstd::optional<pbrt::BSDFSample>::optional(&local_244);
      pstd::optional<pbrt::BSDFSample>::optional(&local_274);
      local_2a8 = local_8;
      local_2b0 = local_10;
      PDF::anon_class_8_1_ba1d750b::operator()
                ((anon_class_8_1_ba1d750b *)
                 CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
      PDF::anon_class_8_1_ba1d750b::operator()
                ((anon_class_8_1_ba1d750b *)
                 CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
      PDF::anon_class_8_1_ba1d750b::operator()
                ((anon_class_8_1_ba1d750b *)
                 CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
      Point2<float>::Point2
                ((Point2<float> *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                 in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8);
      local_2d0 = local_2a8;
      local_2d8 = local_2b0;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff678;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff670;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff670 >> 0x20);
      u_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff65c;
      u_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff658;
      TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::Sample_f
                ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> *)
                 in_stack_fffffffffffff650,wo_00,in_stack_fffffffffffff64c,u_00,
                 in_stack_fffffffffffff648,in_stack_fffffffffffff644);
      pstd::optional<pbrt::BSDFSample>::operator=
                (in_stack_fffffffffffff5f8._8_8_,in_stack_fffffffffffff5f8._0_8_);
      pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)0x846137);
      local_310 = local_24;
      local_318 = local_2c;
      PDF::anon_class_8_1_ba1d750b::operator()
                ((anon_class_8_1_ba1d750b *)
                 CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
      PDF::anon_class_8_1_ba1d750b::operator()
                ((anon_class_8_1_ba1d750b *)
                 CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
      PDF::anon_class_8_1_ba1d750b::operator()
                ((anon_class_8_1_ba1d750b *)
                 CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
      Point2<float>::Point2
                ((Point2<float> *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                 in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8);
      operator!(local_4c);
      local_328 = local_310;
      local_330 = local_318;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff678;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff670;
      wo_01.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff670 >> 0x20);
      u_01.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff65c;
      u_01.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff658;
      TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::Sample_f
                ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> *)
                 in_stack_fffffffffffff650,wo_01,in_stack_fffffffffffff64c,u_01,
                 in_stack_fffffffffffff648,in_stack_fffffffffffff644);
      pstd::optional<pbrt::BSDFSample>::operator=
                (in_stack_fffffffffffff5f8._8_8_,in_stack_fffffffffffff5f8._0_8_);
      pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)0x84625e);
      bVar12 = pstd::optional::operator_cast_to_bool((optional *)&local_244);
      if (bVar12) {
        pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x846291);
        bVar12 = SampledSpectrum::operator_cast_to_bool(in_stack_fffffffffffff5f8._0_8_);
        if (((bVar12) &&
            (pBVar13 = pstd::optional<pbrt::BSDFSample>::operator->
                                 ((optional<pbrt::BSDFSample> *)0x8462ce), 0.0 < pBVar13->pdf)) &&
           (bVar12 = pstd::optional::operator_cast_to_bool((optional *)&local_274), bVar12)) {
          pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x846326);
          bVar12 = SampledSpectrum::operator_cast_to_bool(in_stack_fffffffffffff5f8._0_8_);
          if (bVar12) {
            pBVar13 = pstd::optional<pbrt::BSDFSample>::operator->
                                ((optional<pbrt::BSDFSample> *)0x846363);
            uVar19 = 0;
            if (0.0 < pBVar13->pdf) {
              TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::Flags
                        ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> *)
                         CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
              bVar12 = IsNonSpecular(Unset);
              if (bVar12) {
                pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x8465d6)
                ;
                VVar22 = Tuple3<pbrt::Vector3,_float>::operator-
                                   ((Tuple3<pbrt::Vector3,_float> *)
                                    CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
                local_3d8 = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar9._8_8_ = uVar19;
                auVar9._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                local_3e0 = vmovlpd_avx(auVar9);
                local_3d0 = local_3e0;
                local_3c8 = local_3d8;
                PDF::anon_class_8_1_ba1d750b::operator()
                          ((anon_class_8_1_ba1d750b *)
                           CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
                PDF::anon_class_8_1_ba1d750b::operator()
                          ((anon_class_8_1_ba1d750b *)
                           CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
                PDF::anon_class_8_1_ba1d750b::operator()
                          ((anon_class_8_1_ba1d750b *)
                           CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
                Point2<float>::Point2
                          ((Point2<float> *)
                           CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                           in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8);
                local_3f0 = local_3c8;
                local_3f8 = local_3d0;
                wo_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff678;
                wo_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff670;
                wo_02.super_Tuple3<pbrt::Vector3,_float>.y =
                     (float)(int)((ulong)in_stack_fffffffffffff670 >> 0x20);
                u_02.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff65c;
                u_02.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff658;
                TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::Sample_f
                          ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> *)
                           in_stack_fffffffffffff650,wo_02,in_stack_fffffffffffff64c,u_02,
                           in_stack_fffffffffffff648,in_stack_fffffffffffff644);
                bVar12 = pstd::optional::operator_cast_to_bool(local_3c0);
                if (bVar12) {
                  pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x846748);
                  bVar12 = SampledSpectrum::operator_cast_to_bool(in_stack_fffffffffffff5f8._0_8_);
                  if (bVar12) {
                    pBVar13 = pstd::optional<pbrt::BSDFSample>::operator->
                                        ((optional<pbrt::BSDFSample> *)0x846785);
                    uVar19 = 0;
                    if (0.0 < pBVar13->pdf) {
                      TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::Flags
                                ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> *)
                                 CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
                      bVar12 = IsNonSpecular(Unset);
                      if (bVar12) {
                        pstd::optional<pbrt::BSDFSample>::operator->
                                  ((optional<pbrt::BSDFSample> *)0x846959);
                        VVar22 = Tuple3<pbrt::Vector3,_float>::operator-
                                           ((Tuple3<pbrt::Vector3,_float> *)
                                            CONCAT44(in_stack_fffffffffffff5f4,
                                                     in_stack_fffffffffffff5f0));
                        local_460 = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
                        uVar20 = 0;
                        auVar7._8_8_ = uVar19;
                        auVar7._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                        local_468 = vmovlpd_avx(auVar7);
                        local_458 = local_468;
                        local_450 = local_460;
                        pstd::optional<pbrt::BSDFSample>::operator->
                                  ((optional<pbrt::BSDFSample> *)0x8469d7);
                        VVar22 = Tuple3<pbrt::Vector3,_float>::operator-
                                           ((Tuple3<pbrt::Vector3,_float> *)
                                            CONCAT44(in_stack_fffffffffffff5f4,
                                                     in_stack_fffffffffffff5f0));
                        local_4a0 = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar6._8_8_ = uVar20;
                        auVar6._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                        local_4a8 = vmovlpd_avx(auVar6);
                        local_490 = local_450;
                        local_498 = local_458;
                        wo_08.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff6c0;
                        wo_08.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff6b8;
                        wi_03.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff6a0;
                        wi_03.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff69c;
                        local_488 = local_4a8;
                        local_480 = local_4a0;
                        local_478 = local_4a8;
                        local_470 = local_4a0;
                        local_44c = TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::PDF
                                              ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>
                                                *)in_stack_fffffffffffff680,wo_08,wi_03,
                                               in_stack_fffffffffffff67c,
                                               (BxDFReflTransFlags)in_stack_fffffffffffff678);
                        pstd::optional<pbrt::BSDFSample>::operator->
                                  ((optional<pbrt::BSDFSample> *)0x846aeb);
                        local_4ac = PowerHeuristic(in_stack_fffffffffffff5f8._8_4_,
                                                   in_stack_fffffffffffff5f8._4_4_,
                                                   in_stack_fffffffffffff5f8._0_4_,
                                                   in_stack_fffffffffffff5f4);
                        local_f0 = local_f0 + local_4ac * local_44c;
                        uVar19 = 0;
                        pstd::optional<pbrt::BSDFSample>::operator->
                                  ((optional<pbrt::BSDFSample> *)0x846b6d);
                        VVar22 = Tuple3<pbrt::Vector3,_float>::operator-
                                           ((Tuple3<pbrt::Vector3,_float> *)
                                            CONCAT44(in_stack_fffffffffffff5f4,
                                                     in_stack_fffffffffffff5f0));
                        local_4e8 = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar5._8_8_ = uVar19;
                        auVar5._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                        local_4f0 = vmovlpd_avx(auVar5);
                        local_4d8 = local_24;
                        local_4e0 = local_2c;
                        local_4f8 = local_24;
                        local_500 = local_2c;
                        wo_09.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff6c0;
                        wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff6b8;
                        wi_04.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff6a0;
                        wi_04.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff69c;
                        local_4d0 = local_4f0;
                        local_4c8 = local_4e8;
                        local_4c0 = local_4f0;
                        local_4b8 = local_4e8;
                        local_4b0 = TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::PDF
                                              ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>
                                                *)in_stack_fffffffffffff680,wo_09,wi_04,
                                               in_stack_fffffffffffff67c,
                                               (BxDFReflTransFlags)in_stack_fffffffffffff678);
                        pstd::optional<pbrt::BSDFSample>::operator->
                                  ((optional<pbrt::BSDFSample> *)0x846c9f);
                        local_4ac = PowerHeuristic(in_stack_fffffffffffff5f8._8_4_,
                                                   in_stack_fffffffffffff5f8._4_4_,
                                                   in_stack_fffffffffffff5f8._0_4_,
                                                   in_stack_fffffffffffff5f4);
                        local_f0 = local_4ac * local_4b0 + local_f0;
                      }
                      else {
                        pstd::optional<pbrt::BSDFSample>::operator->
                                  ((optional<pbrt::BSDFSample> *)0x8467f3);
                        VVar22 = Tuple3<pbrt::Vector3,_float>::operator-
                                           ((Tuple3<pbrt::Vector3,_float> *)
                                            CONCAT44(in_stack_fffffffffffff5f4,
                                                     in_stack_fffffffffffff5f0));
                        local_430 = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar8._8_8_ = uVar19;
                        auVar8._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                        local_438 = vmovlpd_avx(auVar8);
                        local_420 = local_24;
                        local_428 = local_2c;
                        local_440 = local_24;
                        local_448 = local_2c;
                        wo_07.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff6c0;
                        wo_07.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff6b8;
                        wi_02.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff6a0;
                        wi_02.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff69c;
                        local_418 = local_438;
                        local_410 = local_430;
                        local_408 = local_438;
                        local_400 = local_430;
                        FVar15 = TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::PDF
                                           ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>
                                             *)in_stack_fffffffffffff680,wo_07,wi_02,
                                            in_stack_fffffffffffff67c,
                                            (BxDFReflTransFlags)in_stack_fffffffffffff678);
                        local_f0 = FVar15 + local_f0;
                      }
                    }
                  }
                }
                pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)0x846d1b);
              }
              else {
                pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x8463d1)
                ;
                VVar22 = Tuple3<pbrt::Vector3,_float>::operator-
                                   ((Tuple3<pbrt::Vector3,_float> *)
                                    CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
                local_348 = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
                uVar20 = 0;
                auVar11._8_8_ = uVar19;
                auVar11._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                local_350 = vmovlpd_avx(auVar11);
                local_340 = local_350;
                local_338 = local_348;
                pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x84644f)
                ;
                VVar22 = Tuple3<pbrt::Vector3,_float>::operator-
                                   ((Tuple3<pbrt::Vector3,_float> *)
                                    CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
                local_388 = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar10._8_8_ = uVar20;
                auVar10._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                local_390 = vmovlpd_avx(auVar10);
                local_378 = local_338;
                local_380 = local_340;
                wo_06.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff6c0;
                wo_06.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff6b8;
                wi_01.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff6a0;
                wi_01.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff69c;
                local_370 = local_390;
                local_368 = local_388;
                local_360 = local_390;
                local_358 = local_388;
                FVar15 = TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::PDF
                                   ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> *)
                                    in_stack_fffffffffffff680,wo_06,wi_01,in_stack_fffffffffffff67c,
                                    (BxDFReflTransFlags)in_stack_fffffffffffff678);
                local_f0 = FVar15 + local_f0;
              }
            }
          }
        }
      }
      pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)0x846d2a);
      pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)0x846d37);
    }
    else {
      TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::TopOrBottomBxDF(&local_510);
      TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::TopOrBottomBxDF(&local_520);
      if ((local_e9 & 1) == 0) {
        TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::operator=
                  (&local_510,(DiffuseBxDF *)(in_RDI + 1));
        TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::operator=(&local_520,in_RDI);
      }
      else {
        TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::operator=(&local_510,in_RDI);
        TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::operator=
                  (&local_520,(DiffuseBxDF *)(in_RDI + 1));
      }
      local_524 = PDF::anon_class_8_1_ba1d750b::operator()
                            ((anon_class_8_1_ba1d750b *)
                             CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
      PDF::anon_class_8_1_ba1d750b::operator()
                ((anon_class_8_1_ba1d750b *)
                 CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
      PDF::anon_class_8_1_ba1d750b::operator()
                ((anon_class_8_1_ba1d750b *)
                 CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
      Point2<float>::Point2
                ((Point2<float> *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                 in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8);
      local_568 = local_8;
      local_570 = local_10;
      local_578 = local_530;
      local_580 = local_8;
      local_588 = local_10;
      wo_03.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff678;
      wo_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff670;
      wo_03.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff670 >> 0x20);
      u_03.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff65c;
      u_03.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff658;
      TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::Sample_f
                ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> *)
                 in_stack_fffffffffffff650,wo_03,in_stack_fffffffffffff64c,u_03,
                 in_stack_fffffffffffff648,in_stack_fffffffffffff644);
      bVar12 = pstd::optional::operator_cast_to_bool(local_560);
      if (bVar12) {
        pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x846f04);
        bVar12 = SampledSpectrum::operator_cast_to_bool(in_stack_fffffffffffff5f8._0_8_);
        if (!bVar12) goto LAB_00846fd2;
        pBVar13 = pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x846f41);
        if ((pBVar13->pdf == 0.0) && (!NAN(pBVar13->pdf))) goto LAB_00846fd2;
        pBVar13 = pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x846f73);
        fVar1 = (pBVar13->wi).super_Tuple3<pbrt::Vector3,_float>.z;
        if ((fVar1 == 0.0) && (!NAN(fVar1))) goto LAB_00846fd2;
        pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x846fa5);
        bVar12 = BSDFSample::IsReflection((BSDFSample *)0x846fbc);
        if (bVar12) goto LAB_00846fd2;
        local_524 = PDF::anon_class_8_1_ba1d750b::operator()
                              ((anon_class_8_1_ba1d750b *)
                               CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
        PDF::anon_class_8_1_ba1d750b::operator()
                  ((anon_class_8_1_ba1d750b *)
                   CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
        PDF::anon_class_8_1_ba1d750b::operator()
                  ((anon_class_8_1_ba1d750b *)
                   CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
        Point2<float>::Point2
                  ((Point2<float> *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                   in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8);
        local_530 = local_594;
        operator!(local_4c);
        wo_04.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff678;
        wo_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff670;
        wo_04.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffff670 >> 0x20);
        u_04.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff65c;
        u_04.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff658;
        TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::Sample_f
                  ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> *)
                   in_stack_fffffffffffff650,wo_04,in_stack_fffffffffffff64c,u_04,
                   in_stack_fffffffffffff648,in_stack_fffffffffffff644);
        bVar12 = pstd::optional::operator_cast_to_bool(local_5c4);
        if (bVar12) {
          in_stack_fffffffffffff6b8 =
               pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x847173);
          bVar12 = SampledSpectrum::operator_cast_to_bool(in_stack_fffffffffffff5f8._0_8_);
          if (!bVar12) goto LAB_00847241;
          pBVar13 = pstd::optional<pbrt::BSDFSample>::operator->
                              ((optional<pbrt::BSDFSample> *)0x8471b0);
          if ((pBVar13->pdf == 0.0) && (!NAN(pBVar13->pdf))) goto LAB_00847241;
          in_stack_fffffffffffff6a0 =
               pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x8471e2);
          fVar1 = (in_stack_fffffffffffff6a0->wi).super_Tuple3<pbrt::Vector3,_float>.z;
          uVar19 = 0;
          if ((fVar1 == 0.0) && (!NAN(fVar1))) goto LAB_00847241;
          pBVar13 = pstd::optional<pbrt::BSDFSample>::operator->
                              ((optional<pbrt::BSDFSample> *)0x847214);
          in_stack_fffffffffffff69c = (float)((ulong)pBVar13 >> 0x20);
          bVar12 = BSDFSample::IsReflection((BSDFSample *)0x84722b);
          if (bVar12) goto LAB_00847241;
          TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::Flags
                    ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> *)
                     CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
          bVar12 = IsSpecular(Unset);
          if (bVar12) {
            in_stack_fffffffffffff680 =
                 pstd::optional<pbrt::BSDFSample>::operator->
                           ((optional<pbrt::BSDFSample> *)0x8472bf);
            VVar22 = Tuple3<pbrt::Vector3,_float>::operator-
                               ((Tuple3<pbrt::Vector3,_float> *)
                                CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
            auVar4._8_8_ = uVar19;
            auVar4._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
            vmovlpd_avx(auVar4);
            wo_10.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff6c0;
            wo_10.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff6b8;
            wi_05.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff6a0;
            wi_05.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff69c;
            FVar15 = TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::PDF
                               ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> *)
                                in_stack_fffffffffffff680,wo_10,wi_05,in_stack_fffffffffffff67c,
                                (BxDFReflTransFlags)in_stack_fffffffffffff678);
            local_f0 = FVar15 + local_f0;
            in_stack_fffffffffffff670 = uVar19;
          }
          else {
            in_stack_fffffffffffff65c =
                 (float)TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::Flags
                                  ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> *)
                                   CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
            bVar12 = IsSpecular(Unset);
            in_stack_fffffffffffff658 = (float)CONCAT13(bVar12,SUB43(in_stack_fffffffffffff658,0));
            if (bVar12) {
              in_stack_fffffffffffff650 =
                   pstd::optional<pbrt::BSDFSample>::operator->
                             ((optional<pbrt::BSDFSample> *)0x847440);
              VVar22 = Tuple3<pbrt::Vector3,_float>::operator-
                                 ((Tuple3<pbrt::Vector3,_float> *)
                                  CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
              in_stack_fffffffffffff644 = (BxDFReflTransFlags)((ulong)uVar19 >> 0x20);
              auVar3._8_4_ = (int)uVar19;
              auVar3._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar3._12_4_ = in_stack_fffffffffffff644;
              vmovlpd_avx(auVar3);
              wo_11.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff6c0;
              wo_11.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff6b8;
              wi_06.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff6a0;
              wi_06.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff69c;
              FVar15 = TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::PDF
                                 ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> *)
                                  in_stack_fffffffffffff680,wo_11,wi_06,in_stack_fffffffffffff67c,
                                  (BxDFReflTransFlags)in_stack_fffffffffffff678);
              local_f0 = FVar15 + local_f0;
            }
            else {
              pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x847568);
              VVar22 = Tuple3<pbrt::Vector3,_float>::operator-
                                 ((Tuple3<pbrt::Vector3,_float> *)
                                  CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
              uStack_9e0 = (undefined4)uVar19;
              auVar2._8_4_ = uStack_9e0;
              auVar2._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar2._12_4_ = (int)((ulong)uVar19 >> 0x20);
              vmovlpd_avx(auVar2);
              wo_12.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff6c0;
              wo_12.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff6b8;
              wi_07.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff6a0;
              wi_07.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff69c;
              FVar15 = TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::PDF
                                 ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> *)
                                  in_stack_fffffffffffff680,wo_12,wi_07,in_stack_fffffffffffff67c,
                                  (BxDFReflTransFlags)in_stack_fffffffffffff678);
              auVar21 = extraout_var;
              pstd::optional<pbrt::BSDFSample>::operator->((optional<pbrt::BSDFSample> *)0x847655);
              VVar22 = Tuple3<pbrt::Vector3,_float>::operator-
                                 ((Tuple3<pbrt::Vector3,_float> *)
                                  CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
              in_stack_fffffffffffff5f4 = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar18._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar18._8_56_ = auVar21;
              in_stack_fffffffffffff5f8 = auVar18._0_16_;
              vmovlpd_avx(in_stack_fffffffffffff5f8);
              wo_13.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff6c0;
              wo_13.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff6b8;
              wi_08.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff6a0;
              wi_08.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff69c;
              in_stack_fffffffffffff5f0 =
                   TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF>::PDF
                             ((TopOrBottomBxDF<pbrt::DielectricBxDF,_pbrt::DiffuseBxDF> *)
                              in_stack_fffffffffffff680,wo_13,wi_08,in_stack_fffffffffffff67c,
                              (BxDFReflTransFlags)in_stack_fffffffffffff678);
              local_f0 = (FVar15 + in_stack_fffffffffffff5f0) / 2.0 + local_f0;
            }
          }
          local_58c = 0;
        }
        else {
LAB_00847241:
          local_58c = 4;
        }
        pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)0x84779b);
      }
      else {
LAB_00846fd2:
        local_58c = 4;
      }
      pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)0x8477a8);
    }
    local_1b4 = local_1b4 + 1;
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        CHECK(sampleFlags == BxDFReflTransFlags::All);  // for now
        // Set _wo_ and _wi_ for layered BSDF evaluation
        if (twoSided && wo.z < 0) {
            wo = -wo;
            wi = -wi;
        }

        // Declare _RNG_ for layered PDF evaluation
        RNG rng(Hash(GetOptions().seed, wi), Hash(wo));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        // Update _pdfSum_ for reflection at the entrance layer
        bool enteredTop = twoSided || wo.z > 0;
        Float pdfSum = 0;
        if (SameHemisphere(wo, wi)) {
            auto reflFlag = BxDFReflTransFlags::Reflection;
            pdfSum += enteredTop ? nSamples * top.PDF(wo, wi, mode, reflFlag)
                                 : nSamples * bottom.PDF(wo, wi, mode, reflFlag);
        }

        for (int s = 0; s < nSamples; ++s) {
            // Evaluate layered BSDF PDF sample
            if (SameHemisphere(wo, wi)) {
                // Evaluate TRT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> rInterface, tInterface;
                if (enteredTop) {
                    rInterface = &bottom;
                    tInterface = &top;
                } else {
                    rInterface = &top;
                    tInterface = &bottom;
                }
                // Sample _tInterface_ to get direction into the layers
                auto trans = BxDFReflTransFlags::Transmission;
                pstd::optional<BSDFSample> wos, wis;
                wos = tInterface.Sample_f(wo, r(), {r(), r()}, mode, trans);
                wis = tInterface.Sample_f(wi, r(), {r(), r()}, !mode, trans);

                // Update _pdfSum_ accounting for TRT scattering events
                if (wos && wos->f && wos->pdf > 0 && wis && wis->f && wis->pdf > 0) {
                    if (!IsNonSpecular(tInterface.Flags()))
                        pdfSum += rInterface.PDF(-wos->wi, -wis->wi, mode);
                    else {
                        // Use multiple importance sampling to estimate PDF product
                        pstd::optional<BSDFSample> rs =
                            rInterface.Sample_f(-wos->wi, r(), {r(), r()}, mode);
                        if (rs && rs->f && rs->pdf > 0) {
                            if (!IsNonSpecular(rInterface.Flags()))
                                pdfSum += tInterface.PDF(-rs->wi, wi, mode);
                            else {
                                // Compute MIS-weighted estimate of Equation
                                // (\ref{eq:pdf-triple-canceled-one})
                                Float rPDF = rInterface.PDF(-wos->wi, -wis->wi, mode);
                                Float wt = PowerHeuristic(1, wis->pdf, 1, rPDF);
                                pdfSum += wt * rPDF;

                                Float tPDF = tInterface.PDF(-rs->wi, wi, mode);
                                wt = PowerHeuristic(1, rs->pdf, 1, tPDF);
                                pdfSum += wt * tPDF;
                            }
                        }
                    }
                }

            } else {
                // Evaluate TT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> toInterface, tiInterface;
                if (enteredTop) {
                    toInterface = &top;
                    tiInterface = &bottom;
                } else {
                    toInterface = &bottom;
                    tiInterface = &top;
                }

                Float uc = r();
                Point2f u(r(), r());
                pstd::optional<BSDFSample> wos = toInterface.Sample_f(wo, uc, u, mode);
                if (!wos || !wos->f || wos->pdf == 0 || wos->wi.z == 0 ||
                    wos->IsReflection())
                    continue;

                uc = r();
                u = Point2f(r(), r());
                pstd::optional<BSDFSample> wis = tiInterface.Sample_f(wi, uc, u, !mode);
                if (!wis || !wis->f || wis->pdf == 0 || wis->wi.z == 0 ||
                    wis->IsReflection())
                    continue;

                if (IsSpecular(toInterface.Flags()))
                    pdfSum += tiInterface.PDF(-wos->wi, wi, mode);
                else if (IsSpecular(tiInterface.Flags()))
                    pdfSum += toInterface.PDF(wo, -wis->wi, mode);
                else
                    pdfSum += (toInterface.PDF(wo, -wis->wi, mode) +
                               tiInterface.PDF(-wos->wi, wi, mode)) /
                              2;
            }
        }
        // Return mixture of PDF estimate and constant PDF
        return Lerp(0.9f, 1 / (4 * Pi), pdfSum / nSamples);
    }